

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

void init_parallel_tasks(work_item *tasks,work_item *init,_func_void_work_item_ptr_size_t *compute,
                        size_t task_size,size_t task_count)

{
  work_item *__dest;
  work_item *pwVar1;
  work_item *task;
  size_t i;
  size_t task_count_local;
  size_t task_size_local;
  _func_void_work_item_ptr_size_t *compute_local;
  work_item *init_local;
  work_item *tasks_local;
  
  init->work_fn = compute;
  init->next = (work_item *)0x0;
  for (task = (work_item *)0x0; task < task_count; task = (work_item *)((long)&task->work_fn + 1)) {
    __dest = task_at(tasks,task_size,(size_t)task);
    memcpy(__dest,init,task_size);
    if (task != (work_item *)(task_count - 1)) {
      pwVar1 = task_at(tasks,task_size,(size_t)((long)&task->work_fn + 1));
      __dest->next = pwVar1;
    }
  }
  return;
}

Assistant:

static inline void init_parallel_tasks(
    struct work_item* tasks,
    struct work_item* init,
    void (*compute)(struct work_item*, size_t),
    size_t task_size, size_t task_count)
{
    init->work_fn = compute; 
    init->next    = NULL;
    for (size_t i = 0; i < task_count; ++i) {
        struct work_item* task = task_at(tasks, task_size, i);
        memcpy(task, init, task_size);
        if (i != task_count - 1)
            task->next = task_at(tasks, task_size, i + 1);
    }
}